

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::ContributeGlobalDiagonal
          (TPZDohrSubstruct<std::complex<float>_> *this,
          TPZFMatrix<std::complex<float>_> *StiffnessDiag)

{
  _ComplexT _Var1;
  uint uVar2;
  int iVar3;
  pair<int,_int> *ppVar4;
  ulong uVar5;
  complex<float> *pcVar6;
  complex<float> *pcVar7;
  ulong uVar8;
  long lVar9;
  
  TPZManVector<std::complex<float>,_10>::Resize(&this->fWeights,(long)this->fNEquations);
  for (lVar9 = 0; uVar5 = (ulong)this->fNEquations, lVar9 < (long)uVar5; lVar9 = lVar9 + 1) {
    pcVar6 = TPZMatrix<std::complex<float>_>::operator()
                       (((this->fStiffness).fRef)->fPointer,lVar9,lVar9);
    (this->fWeights).super_TPZVec<std::complex<float>_>.fStore[lVar9]._M_value = pcVar6->_M_value;
  }
  if (fWeightType == CorrectWeight) {
    for (lVar9 = 0; lVar9 < (int)uVar5; lVar9 = lVar9 + 1) {
      pcVar6 = TPZMatrix<std::complex<float>_>::operator()
                         (((this->fStiffness).fRef)->fPointer,lVar9,lVar9);
      (this->fWeights).super_TPZVec<std::complex<float>_>.fStore[lVar9]._M_value = pcVar6->_M_value;
      uVar5 = (ulong)(uint)this->fNEquations;
    }
    for (lVar9 = 0; lVar9 < (this->fCoarseNodes).fNElements; lVar9 = lVar9 + 1) {
      pcVar6 = TPZFMatrix<std::complex<float>_>::operator()(&this->fKCi,lVar9,lVar9);
      (this->fWeights).super_TPZVec<std::complex<float>_>.fStore[(this->fCoarseNodes).fStore[lVar9]]
      ._M_value = pcVar6->_M_value;
    }
  }
  else {
    for (lVar9 = 0; lVar9 < (int)uVar5; lVar9 = lVar9 + 1) {
      (this->fWeights).super_TPZVec<std::complex<float>_>.fStore[lVar9]._M_value = 0x3f800000;
      uVar5 = (ulong)(uint)this->fNEquations;
    }
    for (lVar9 = 0; lVar9 < (this->fCoarseNodes).fNElements; lVar9 = lVar9 + 1) {
      (this->fWeights).super_TPZVec<std::complex<float>_>.fStore[(this->fCoarseNodes).fStore[lVar9]]
      ._M_value = 0x3f800000;
    }
  }
  uVar2 = (uint)(this->fGlobalEqs).fNElements;
  uVar8 = 0;
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = uVar8;
  }
  for (; uVar5 != uVar8; uVar8 = uVar8 + 1) {
    pcVar6 = (this->fWeights).super_TPZVec<std::complex<float>_>.fStore;
    ppVar4 = (this->fGlobalEqs).fStore;
    iVar3 = ppVar4[uVar8].first;
    pcVar7 = TPZFMatrix<std::complex<float>_>::operator()
                       (StiffnessDiag,(long)ppVar4[uVar8].second,0);
    _Var1 = pcVar6[iVar3]._M_value;
    pcVar7->_M_value =
         CONCAT44((float)(pcVar7->_M_value >> 0x20) + (float)(_Var1 >> 0x20),
                  (float)pcVar7->_M_value + (float)_Var1);
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ContributeGlobalDiagonal(TPZFMatrix<TVar> &StiffnessDiag) {
	int i;
	fWeights.Resize(fNEquations);
	//fWeights = diag(kci) if u(i) is on coarse or diag(Ki)
	for (i=0;i<fNEquations;i++) {
		fWeights[i] = fStiffness->operator()(i,i);
	}
	if(fWeightType == CorrectWeight)
	{
		for (i=0;i<fNEquations;i++) {
			fWeights[i] = fStiffness->operator()(i,i);
		}
		for (i=0;i<fCoarseNodes.NElements();i++) {
			fWeights[fCoarseNodes[i]] = fKCi(i,i);
		}
	} else {
		for (i=0;i<fNEquations;i++) {
			fWeights[i] = 1.;
		}
		for (i=0;i<fCoarseNodes.NElements();i++) {
			fWeights[fCoarseNodes[i]] = 1.;
		}
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Weight used for assembly" << fWeights;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		StiffnessDiag(ind.second,0) += fWeights[ind.first];
	}
}